

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMan.c
# Opt level: O0

void Amap_ManStop(Amap_Man_t *p)

{
  Amap_Man_t *p_local;
  
  Vec_PtrFree(p->vPis);
  Vec_PtrFree(p->vPos);
  Vec_PtrFree(p->vObjs);
  Vec_PtrFree(p->vCuts0);
  Vec_PtrFree(p->vCuts1);
  Vec_PtrFree(p->vCuts2);
  Vec_PtrFree(p->vTempP);
  Vec_IntFree(p->vTemp);
  Aig_MmFixedStop(p->pMemObj,0);
  Aig_MmFlexStop(p->pMemCuts,0);
  Aig_MmFlexStop(p->pMemCutBest,0);
  Aig_MmFlexStop(p->pMemTemp,0);
  if (p->pMatsTemp != (int *)0x0) {
    free(p->pMatsTemp);
    p->pMatsTemp = (int *)0x0;
  }
  if (p->ppCutsTemp != (Amap_Cut_t **)0x0) {
    free(p->ppCutsTemp);
    p->ppCutsTemp = (Amap_Cut_t **)0x0;
  }
  if (p->pCutsPi != (Amap_Cut_t *)0x0) {
    free(p->pCutsPi);
    p->pCutsPi = (Amap_Cut_t *)0x0;
  }
  if (p != (Amap_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Amap_ManStop( Amap_Man_t * p )
{
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vCuts0 );
    Vec_PtrFree( p->vCuts1 );
    Vec_PtrFree( p->vCuts2 );
    Vec_PtrFree( p->vTempP );
    Vec_IntFree( p->vTemp );
    Aig_MmFixedStop( p->pMemObj, 0 );
    Aig_MmFlexStop( p->pMemCuts, 0 );
    Aig_MmFlexStop( p->pMemCutBest, 0 );
    Aig_MmFlexStop( p->pMemTemp, 0 );
    ABC_FREE( p->pMatsTemp );
    ABC_FREE( p->ppCutsTemp );
    ABC_FREE( p->pCutsPi );
    ABC_FREE( p );
}